

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O0

void init_link(ixgbe_device *dev)

{
  uint8_t *puVar1;
  uint32_t uVar2;
  long in_RDI;
  uint8_t *unaff_retaddr;
  
  puVar1 = *(uint8_t **)(in_RDI + 0x70);
  uVar2 = get_reg32(*(uint8_t **)(in_RDI + 0x70),0x42a0);
  set_reg32(puVar1,0x42a0,uVar2 & 0xffff1fff | 0x6000);
  puVar1 = *(uint8_t **)(in_RDI + 0x70);
  uVar2 = get_reg32(*(uint8_t **)(in_RDI + 0x70),0x42a0);
  set_reg32(puVar1,0x42a0,uVar2 & 0xfffffe7f);
  set_flags32(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI);
  return;
}

Assistant:

static void init_link(struct ixgbe_device* dev) {
	// should already be set by the eeprom config, maybe we shouldn't override it here to support weirdo nics?
	set_reg32(dev->addr, IXGBE_AUTOC, (get_reg32(dev->addr, IXGBE_AUTOC) & ~IXGBE_AUTOC_LMS_MASK) | IXGBE_AUTOC_LMS_10G_SERIAL);
	set_reg32(dev->addr, IXGBE_AUTOC, (get_reg32(dev->addr, IXGBE_AUTOC) & ~IXGBE_AUTOC_10G_PMA_PMD_MASK) | IXGBE_AUTOC_10G_XAUI);
	// negotiate link
	set_flags32(dev->addr, IXGBE_AUTOC, IXGBE_AUTOC_AN_RESTART);
	// datasheet wants us to wait for the link here, but we can continue and wait afterwards
}